

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  uchar uVar1;
  byte bVar2;
  uchar *__ptr;
  int iVar3;
  byte *pbVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long *in_FS_OFFSET;
  
  if (req_comp != img_n) {
    uVar10 = (ulong)y;
    uVar14 = 0;
    __ptr = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
    if (__ptr == (uchar *)0x0) {
      free(data);
      lVar5 = *in_FS_OFFSET;
      pcVar6 = "outofmem";
LAB_0013ff58:
      *(char **)(lVar5 + -0x20) = pcVar6;
      data = (uchar *)0x0;
    }
    else {
      if ((int)y < 1) {
        uVar10 = 0;
      }
      iVar9 = req_comp + img_n * 8;
      iVar7 = x - 1;
      uVar12 = 0;
      for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
        if (0x19 < iVar9 - 10U) {
switchD_0013fcbd_caseD_d:
          free(data);
          free(__ptr);
          lVar5 = *in_FS_OFFSET;
          pcVar6 = "unsupported";
          goto LAB_0013ff58;
        }
        uVar8 = (ulong)uVar14;
        iVar3 = (int)uVar13 * x;
        pbVar11 = data + (uint)(iVar3 * img_n);
        pbVar4 = __ptr + (uint)(iVar3 * req_comp);
        switch(iVar9) {
        case 10:
          lVar5 = 0;
          for (iVar3 = iVar7; -1 < iVar3; iVar3 = iVar3 + -1) {
            __ptr[lVar5 * 2 + uVar8] = data[lVar5 + uVar12];
            __ptr[lVar5 * 2 + uVar8 + 1] = 0xff;
            lVar5 = lVar5 + 1;
          }
          break;
        case 0xb:
          pbVar4 = __ptr + uVar8 + 2;
          for (iVar3 = iVar7; -1 < iVar3; iVar3 = iVar3 + -1) {
            bVar2 = *pbVar11;
            *pbVar4 = bVar2;
            pbVar4[-1] = bVar2;
            pbVar4[-2] = bVar2;
            pbVar11 = pbVar11 + 1;
            pbVar4 = pbVar4 + 3;
          }
          break;
        case 0xc:
          lVar5 = 0;
          for (iVar3 = iVar7; -1 < iVar3; iVar3 = iVar3 + -1) {
            uVar1 = data[lVar5 + uVar12];
            __ptr[lVar5 * 4 + uVar8 + 2] = uVar1;
            __ptr[lVar5 * 4 + uVar8 + 1] = uVar1;
            __ptr[lVar5 * 4 + uVar8] = uVar1;
            __ptr[lVar5 * 4 + uVar8 + 3] = 0xff;
            lVar5 = lVar5 + 1;
          }
          break;
        default:
          goto switchD_0013fcbd_caseD_d;
        case 0x11:
          lVar5 = 0;
          for (iVar3 = iVar7; -1 < iVar3; iVar3 = iVar3 + -1) {
            __ptr[lVar5 + uVar8] = data[lVar5 * 2 + uVar12];
            lVar5 = lVar5 + 1;
          }
          break;
        case 0x13:
          pbVar4 = __ptr + uVar8 + 2;
          for (iVar3 = iVar7; -1 < iVar3; iVar3 = iVar3 + -1) {
            bVar2 = *pbVar11;
            *pbVar4 = bVar2;
            pbVar4[-1] = bVar2;
            pbVar4[-2] = bVar2;
            pbVar11 = pbVar11 + 2;
            pbVar4 = pbVar4 + 3;
          }
          break;
        case 0x14:
          lVar5 = 0;
          for (iVar3 = iVar7; -1 < iVar3; iVar3 = iVar3 + -1) {
            uVar1 = data[lVar5 + uVar12];
            __ptr[lVar5 * 2 + uVar8 + 2] = uVar1;
            __ptr[lVar5 * 2 + uVar8 + 1] = uVar1;
            __ptr[lVar5 * 2 + uVar8] = uVar1;
            __ptr[lVar5 * 2 + uVar8 + 3] = data[lVar5 + uVar12 + 1];
            lVar5 = lVar5 + 2;
          }
          break;
        case 0x19:
          for (iVar3 = iVar7; -1 < iVar3; iVar3 = iVar3 + -1) {
            *pbVar4 = (byte)((uint)pbVar11[2] * 0x1d +
                             (uint)pbVar11[1] * 0x96 + (uint)*pbVar11 * 0x4d >> 8);
            pbVar11 = pbVar11 + 3;
            pbVar4 = pbVar4 + 1;
          }
          break;
        case 0x1a:
          for (iVar3 = iVar7; -1 < iVar3; iVar3 = iVar3 + -1) {
            *pbVar4 = (byte)((uint)pbVar11[2] * 0x1d +
                             (uint)pbVar11[1] * 0x96 + (uint)*pbVar11 * 0x4d >> 8);
            pbVar4[1] = 0xff;
            pbVar11 = pbVar11 + 3;
            pbVar4 = pbVar4 + 2;
          }
          break;
        case 0x1c:
          for (iVar3 = iVar7; -1 < iVar3; iVar3 = iVar3 + -1) {
            *pbVar4 = *pbVar11;
            pbVar4[1] = pbVar11[1];
            pbVar4[2] = pbVar11[2];
            pbVar4[3] = 0xff;
            pbVar11 = pbVar11 + 3;
            pbVar4 = pbVar4 + 4;
          }
          break;
        case 0x21:
          lVar5 = 0;
          for (iVar3 = iVar7; -1 < iVar3; iVar3 = iVar3 + -1) {
            __ptr[lVar5 + uVar8] =
                 (uchar)((uint)data[lVar5 * 4 + uVar12 + 2] * 0x1d +
                         (uint)data[lVar5 * 4 + uVar12 + 1] * 0x96 +
                         (uint)data[lVar5 * 4 + uVar12] * 0x4d >> 8);
            lVar5 = lVar5 + 1;
          }
          break;
        case 0x22:
          lVar5 = 0;
          for (iVar3 = iVar7; -1 < iVar3; iVar3 = iVar3 + -1) {
            __ptr[lVar5 + uVar8] =
                 (uchar)((uint)data[lVar5 * 2 + uVar12 + 2] * 0x1d +
                         (uint)data[lVar5 * 2 + uVar12 + 1] * 0x96 +
                         (uint)data[lVar5 * 2 + uVar12] * 0x4d >> 8);
            __ptr[lVar5 + uVar8 + 1] = data[lVar5 * 2 + uVar12 + 3];
            lVar5 = lVar5 + 2;
          }
          break;
        case 0x23:
          for (iVar3 = iVar7; -1 < iVar3; iVar3 = iVar3 + -1) {
            *pbVar4 = *pbVar11;
            pbVar4[1] = pbVar11[1];
            pbVar4[2] = pbVar11[2];
            pbVar11 = pbVar11 + 4;
            pbVar4 = pbVar4 + 3;
          }
        }
        uVar12 = (ulong)((int)uVar12 + x * img_n);
        uVar14 = uVar14 + x * req_comp;
      }
      free(data);
      data = __ptr;
    }
  }
  return data;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}